

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void pipe_stats_init(nni_pipe *p)

{
  uint32_t uVar1;
  nni_pipe *p_local;
  
  nni_stat_init(&p->st_root,&pipe_stats_init::root_info);
  pipe_stat_init(p,&p->st_id,&pipe_stats_init::id_info);
  pipe_stat_init(p,&p->st_sock_id,&pipe_stats_init::socket_info);
  pipe_stat_init(p,&p->st_rx_msgs,&pipe_stats_init::rx_msgs_info);
  pipe_stat_init(p,&p->st_tx_msgs,&pipe_stats_init::tx_msgs_info);
  pipe_stat_init(p,&p->st_rx_bytes,&pipe_stats_init::rx_bytes_info);
  pipe_stat_init(p,&p->st_tx_bytes,&pipe_stats_init::tx_bytes_info);
  nni_stat_set_id(&p->st_root,p->p_id);
  nni_stat_set_id(&p->st_id,p->p_id);
  uVar1 = nni_sock_id(p->p_sock);
  nni_stat_set_id(&p->st_sock_id,uVar1);
  if (p->p_dialer != (nni_dialer *)0x0) {
    if (p->p_listener != (nni_listener *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/pipe.c",
                0xe2,"p->p_listener == NULL");
    }
    pipe_stat_init(p,&p->st_ep_id,&pipe_stats_init::dialer_info);
    uVar1 = nni_dialer_id(p->p_dialer);
    nni_stat_set_id(&p->st_ep_id,uVar1);
  }
  if (p->p_listener != (nni_listener *)0x0) {
    pipe_stat_init(p,&p->st_ep_id,&pipe_stats_init::listener_info);
    uVar1 = nni_listener_id(p->p_listener);
    nni_stat_set_id(&p->st_ep_id,uVar1);
  }
  return;
}

Assistant:

static void
pipe_stats_init(nni_pipe *p)
{
#ifdef NNG_ENABLE_STATS
	static const nni_stat_info root_info = {
		.si_name = "pipe",
		.si_desc = "pipe statistics",
		.si_type = NNG_STAT_SCOPE,
	};
	static const nni_stat_info id_info = {
		.si_name = "id",
		.si_desc = "pipe id",
		.si_type = NNG_STAT_ID,
	};
	static const nni_stat_info socket_info = {
		.si_name = "socket",
		.si_desc = "socket for pipe",
		.si_type = NNG_STAT_ID,
	};
	static const nni_stat_info rx_msgs_info = {
		.si_name   = "rx_msgs",
		.si_desc   = "messages received",
		.si_type   = NNG_STAT_COUNTER,
		.si_unit   = NNG_UNIT_MESSAGES,
		.si_atomic = true,
	};
	static const nni_stat_info tx_msgs_info = {
		.si_name   = "tx_msgs",
		.si_desc   = "messages sent",
		.si_type   = NNG_STAT_COUNTER,
		.si_unit   = NNG_UNIT_MESSAGES,
		.si_atomic = true,
	};
	static const nni_stat_info rx_bytes_info = {
		.si_name   = "rx_bytes",
		.si_desc   = "bytes received",
		.si_type   = NNG_STAT_COUNTER,
		.si_unit   = NNG_UNIT_BYTES,
		.si_atomic = true,
	};
	static const nni_stat_info tx_bytes_info = {
		.si_name   = "tx_bytes",
		.si_desc   = "bytes sent",
		.si_type   = NNG_STAT_COUNTER,
		.si_unit   = NNG_UNIT_BYTES,
		.si_atomic = true,
	};
	static const nni_stat_info dialer_info = {
		.si_name = "dialer",
		.si_desc = "dialer for pipe",
		.si_type = NNG_STAT_ID,
	};
	static const nni_stat_info listener_info = {
		.si_name = "listener",
		.si_desc = "listener for pipe",
		.si_type = NNG_STAT_ID,
	};

	nni_stat_init(&p->st_root, &root_info);
	pipe_stat_init(p, &p->st_id, &id_info);
	pipe_stat_init(p, &p->st_sock_id, &socket_info);
	pipe_stat_init(p, &p->st_rx_msgs, &rx_msgs_info);
	pipe_stat_init(p, &p->st_tx_msgs, &tx_msgs_info);
	pipe_stat_init(p, &p->st_rx_bytes, &rx_bytes_info);
	pipe_stat_init(p, &p->st_tx_bytes, &tx_bytes_info);

	nni_stat_set_id(&p->st_root, (int) p->p_id);
	nni_stat_set_id(&p->st_id, (int) p->p_id);
	nni_stat_set_id(&p->st_sock_id, (int) nni_sock_id(p->p_sock));

	if (p->p_dialer) {
		NNI_ASSERT(p->p_listener == NULL);
		pipe_stat_init(p, &p->st_ep_id, &dialer_info);
		nni_stat_set_id(
		    &p->st_ep_id, (int) nni_dialer_id(p->p_dialer));
	}
	if (p->p_listener) {
		pipe_stat_init(p, &p->st_ep_id, &listener_info);
		nni_stat_set_id(
		    &p->st_ep_id, (int) nni_listener_id(p->p_listener));
	}
#else
	NNI_ARG_UNUSED(p);
#endif // NNG_ENABLE_STATS
}